

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O2

void __thiscall cursespp::TextInput::TextInput(TextInput *this,Style style,InputMode inputMode)

{
  Window::Window(&this->super_Window,(IWindow *)0x0);
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__TextInput_001c1b70;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__TextInput_001c1d80;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__TextInput_001c1db0;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__TextInput_001c1dd8;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__TextInput_001c1e00;
  (this->super_IInput)._vptr_IInput = (_func_int **)&PTR__TextInput_001c1e28;
  sigslot::signal1<cursespp::TextInput_*,_sigslot::multi_threaded_local>::signal1
            (&this->EnterPressed);
  sigslot::
  signal2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::signal2(&this->TextChanged);
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  (this->hintText)._M_dataplus._M_p = (pointer)&(this->hintText).field_2;
  (this->hintText)._M_string_length = 0;
  (this->hintText).field_2._M_local_buf[0] = '\0';
  this->position = 0;
  this->enterEnabled = true;
  this->truncate = false;
  this->bufferLength = 0;
  this->style = style;
  this->inputMode = inputMode;
  if (style == StyleLine) {
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x11])(this,0);
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0xc])(this);
  }
  return;
}

Assistant:

TextInput::TextInput(TextInput::Style style, IInput::InputMode inputMode)
: Window()
, bufferLength(0)
, position(0)
, style(style)
, inputMode(inputMode)
, enterEnabled(true)
, truncate(false) {
    if (style == StyleLine) {
        this->SetFrameVisible(false);
        this->SetFocusedContentColor(Color::TextFocused);
    }
}